

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_dense.cpp
# Opt level: O0

bool runCase(int testCase)

{
  size_t *psVar1;
  bool bVar2;
  uint a_14;
  int local_64c;
  int local_648;
  int j_3;
  int i_17;
  int b_13;
  int a_13;
  uint i_16;
  DenseGraph g2_6;
  int b_12;
  int a_12;
  uint i_15;
  undefined1 local_5b8 [8];
  DenseGraph g_9;
  int b_11;
  int a_11;
  uint i_14;
  DenseGraph gt_4;
  int k_4;
  int n_4;
  int b_10;
  int a_10;
  uint i_13;
  DenseGraph g_8;
  int b_9;
  int a_9;
  uint i_12;
  DenseGraph gt_3;
  int k_3;
  int n_3;
  int j_2;
  int i_11;
  int b_8;
  int a_8;
  uint i_10;
  DenseGraph g2_5;
  int b_7;
  int a_7;
  uint i_9;
  DenseGraph g_7;
  int b_6;
  int a_6;
  uint i_8;
  DenseGraph gt_2;
  int k_2;
  int n_2;
  int j_1;
  int i_7;
  int b_5;
  int a_5;
  uint i_6;
  DenseGraph g2_4;
  int b_4;
  int a_4;
  uint i_5;
  DenseGraph g_6;
  int b_3;
  int a_3;
  uint i_4;
  DenseGraph gt_1;
  int k_1;
  int n_1;
  int j;
  int i_3;
  int b_2;
  int a_2;
  uint i_2;
  DenseGraph g2_3;
  int b_1;
  int a_1;
  uint i_1;
  DenseGraph g_5;
  int b;
  int a;
  uint i;
  DenseGraph gt;
  int k;
  int n;
  DenseGraph g_4;
  DenseGraph g2_2;
  DenseGraph g_3;
  DenseGraph g2_1;
  DenseGraph g_2;
  DenseGraph g2;
  DenseGraph g_1;
  undefined1 local_48 [8];
  DenseGraph g;
  int testCase_local;
  
  g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = testCase;
  if (testCase == 1) {
    DenseGraph::DenseGraph((DenseGraph *)local_48);
    DenseGraph::AddEdge((DenseGraph *)local_48,0,1);
    bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)local_48,0,1);
    if (bVar2) {
      bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)local_48,1,0);
      if (bVar2) {
        g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
    }
    else {
      g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
      bVar2 = true;
    }
    DenseGraph::~DenseGraph((DenseGraph *)local_48);
    if (bVar2) goto LAB_00103265;
  }
  else if (testCase == 2) {
    psVar1 = &g2.s._M_t._M_impl.super__Rb_tree_header._M_node_count;
    DenseGraph::DenseGraph((DenseGraph *)psVar1,4);
    DenseGraph::AddEdge((DenseGraph *)psVar1,0,1);
    DenseGraph::AddEdge((DenseGraph *)&g2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,0,2);
    DenseGraph::AddEdge((DenseGraph *)&g2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,1,2);
    DenseGraph::AddEdge((DenseGraph *)&g2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,1,3);
    bVar2 = DenseGraph::DoesEdgeExist
                      ((DenseGraph *)&g2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,0,1);
    if (bVar2) {
      bVar2 = DenseGraph::DoesEdgeExist
                        ((DenseGraph *)&g2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,0,2);
      if (bVar2) {
        bVar2 = DenseGraph::DoesEdgeExist
                          ((DenseGraph *)&g2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,1,2)
        ;
        if (bVar2) {
          bVar2 = DenseGraph::DoesEdgeExist
                            ((DenseGraph *)&g2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,1,
                             3);
          if (bVar2) {
            bVar2 = DenseGraph::DoesEdgeExist
                              ((DenseGraph *)&g2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               0,3);
            if (bVar2) {
              g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
              bVar2 = true;
            }
            else {
              bVar2 = DenseGraph::DoesEdgeExist
                                ((DenseGraph *)
                                 &g2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,1,0);
              if (bVar2) {
                g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
                bVar2 = true;
              }
              else {
                bVar2 = false;
              }
            }
          }
          else {
            g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
            bVar2 = true;
          }
        }
        else {
          g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
          bVar2 = true;
        }
      }
      else {
        g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
        bVar2 = true;
      }
    }
    else {
      g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
      bVar2 = true;
    }
    DenseGraph::~DenseGraph((DenseGraph *)&g2.s._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (bVar2) goto LAB_00103265;
  }
  else if (testCase == 3) {
    psVar1 = &g_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count;
    DenseGraph::DenseGraph((DenseGraph *)psVar1,4);
    DenseGraph::DenseGraph
              ((DenseGraph *)&g2_1.s._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (DenseGraph *)psVar1);
    DenseGraph::AddEdge((DenseGraph *)&g2_1.s._M_t._M_impl.super__Rb_tree_header._M_node_count,0,1);
    DenseGraph::AddEdge((DenseGraph *)&g2_1.s._M_t._M_impl.super__Rb_tree_header._M_node_count,0,2);
    DenseGraph::AddEdge((DenseGraph *)&g2_1.s._M_t._M_impl.super__Rb_tree_header._M_node_count,1,2);
    DenseGraph::AddEdge((DenseGraph *)&g2_1.s._M_t._M_impl.super__Rb_tree_header._M_node_count,1,3);
    bVar2 = DenseGraph::DoesEdgeExist
                      ((DenseGraph *)&g2_1.s._M_t._M_impl.super__Rb_tree_header._M_node_count,0,1);
    if (bVar2) {
      bVar2 = DenseGraph::DoesEdgeExist
                        ((DenseGraph *)&g2_1.s._M_t._M_impl.super__Rb_tree_header._M_node_count,0,2)
      ;
      if (bVar2) {
        bVar2 = DenseGraph::DoesEdgeExist
                          ((DenseGraph *)&g2_1.s._M_t._M_impl.super__Rb_tree_header._M_node_count,1,
                           2);
        if (bVar2) {
          bVar2 = DenseGraph::DoesEdgeExist
                            ((DenseGraph *)&g2_1.s._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             1,3);
          if (bVar2) {
            bVar2 = DenseGraph::DoesEdgeExist
                              ((DenseGraph *)
                               &g2_1.s._M_t._M_impl.super__Rb_tree_header._M_node_count,0,3);
            if (bVar2) {
              g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
              bVar2 = true;
            }
            else {
              bVar2 = DenseGraph::DoesEdgeExist
                                ((DenseGraph *)
                                 &g2_1.s._M_t._M_impl.super__Rb_tree_header._M_node_count,1,0);
              if (bVar2) {
                g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
                bVar2 = true;
              }
              else {
                bVar2 = false;
              }
            }
          }
          else {
            g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
            bVar2 = true;
          }
        }
        else {
          g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
          bVar2 = true;
        }
      }
      else {
        g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
        bVar2 = true;
      }
    }
    else {
      g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
      bVar2 = true;
    }
    DenseGraph::~DenseGraph((DenseGraph *)&g2_1.s._M_t._M_impl.super__Rb_tree_header._M_node_count);
    DenseGraph::~DenseGraph((DenseGraph *)&g_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (bVar2) goto LAB_00103265;
  }
  else if (testCase == 4) {
    psVar1 = &g_3.s._M_t._M_impl.super__Rb_tree_header._M_node_count;
    DenseGraph::DenseGraph((DenseGraph *)psVar1,4);
    DenseGraph::DenseGraph
              ((DenseGraph *)&g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (DenseGraph *)psVar1);
    DenseGraph::AddEdge((DenseGraph *)&g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,0,1);
    DenseGraph::AddEdge((DenseGraph *)&g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,0,2);
    DenseGraph::AddEdge((DenseGraph *)&g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,1,2);
    DenseGraph::AddEdge((DenseGraph *)&g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,1,3);
    DenseGraph::AddEdge((DenseGraph *)&g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,2,3);
    DenseGraph::AddEdge((DenseGraph *)&g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,1,0);
    DenseGraph::RemoveEdge
              ((DenseGraph *)&g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,1,0);
    DenseGraph::AddEdge((DenseGraph *)&g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,0,3);
    DenseGraph::RemoveEdge
              ((DenseGraph *)&g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,0,3);
    DenseGraph::AddEdge((DenseGraph *)&g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,3,2);
    DenseGraph::RemoveEdge
              ((DenseGraph *)&g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,3,2);
    DenseGraph::AddEdge((DenseGraph *)&g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,3,3);
    bVar2 = DenseGraph::DoesEdgeExist
                      ((DenseGraph *)&g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,0,1);
    if (bVar2) {
      bVar2 = DenseGraph::DoesEdgeExist
                        ((DenseGraph *)&g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,0,2)
      ;
      if (bVar2) {
        bVar2 = DenseGraph::DoesEdgeExist
                          ((DenseGraph *)&g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,1,
                           2);
        if (bVar2) {
          bVar2 = DenseGraph::DoesEdgeExist
                            ((DenseGraph *)&g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             1,3);
          if (bVar2) {
            bVar2 = DenseGraph::DoesEdgeExist
                              ((DenseGraph *)
                               &g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,2,3);
            if (bVar2) {
              bVar2 = DenseGraph::DoesEdgeExist
                                ((DenseGraph *)
                                 &g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,3,3);
              if (bVar2) {
                bVar2 = DenseGraph::DoesEdgeExist
                                  ((DenseGraph *)
                                   &g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,0,3);
                if (bVar2) {
                  g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
                  bVar2 = true;
                }
                else {
                  bVar2 = DenseGraph::DoesEdgeExist
                                    ((DenseGraph *)
                                     &g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,1,0);
                  if (bVar2) {
                    g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
                    bVar2 = true;
                  }
                  else {
                    bVar2 = DenseGraph::DoesEdgeExist
                                      ((DenseGraph *)
                                       &g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count,3,2)
                    ;
                    if (bVar2) {
                      g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
                      bVar2 = true;
                    }
                    else {
                      bVar2 = false;
                    }
                  }
                }
              }
              else {
                g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
                bVar2 = true;
              }
            }
            else {
              g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
              bVar2 = true;
            }
          }
          else {
            g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
            bVar2 = true;
          }
        }
        else {
          g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
          bVar2 = true;
        }
      }
      else {
        g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
        bVar2 = true;
      }
    }
    else {
      g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
      bVar2 = true;
    }
    DenseGraph::~DenseGraph((DenseGraph *)&g2_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count);
    DenseGraph::~DenseGraph((DenseGraph *)&g_3.s._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (bVar2) goto LAB_00103265;
  }
  else if (testCase == 5) {
    DenseGraph::DenseGraph((DenseGraph *)&g_4.s._M_t._M_impl.super__Rb_tree_header._M_node_count,5);
    DenseGraph::DenseGraph((DenseGraph *)&k,2);
    DenseGraph::operator=
              ((DenseGraph *)&k,
               (DenseGraph *)&g_4.s._M_t._M_impl.super__Rb_tree_header._M_node_count);
    DenseGraph::RemoveEdge((DenseGraph *)&k,1,2);
    DenseGraph::RemoveEdge((DenseGraph *)&k,0,1);
    DenseGraph::AddEdge((DenseGraph *)&k,0,1);
    DenseGraph::AddEdge((DenseGraph *)&k,0,2);
    DenseGraph::AddEdge((DenseGraph *)&k,1,2);
    DenseGraph::RemoveEdge((DenseGraph *)&k,1,3);
    DenseGraph::AddEdge((DenseGraph *)&k,1,3);
    DenseGraph::RemoveEdge((DenseGraph *)&k,4,2);
    DenseGraph::AddEdge((DenseGraph *)&k,4,2);
    DenseGraph::RemoveEdge((DenseGraph *)&k,1,0);
    DenseGraph::AddEdge((DenseGraph *)&k,0,3);
    DenseGraph::RemoveEdge((DenseGraph *)&k,0,3);
    DenseGraph::AddEdge((DenseGraph *)&k,3,2);
    DenseGraph::RemoveEdge((DenseGraph *)&k,3,2);
    bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&k,0,1);
    if (bVar2) {
      bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&k,0,2);
      if (bVar2) {
        bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&k,1,2);
        if (bVar2) {
          bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&k,1,3);
          if (bVar2) {
            bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&k,4,2);
            if (bVar2) {
              bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&k,0,3);
              if (bVar2) {
                g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
                bVar2 = true;
              }
              else {
                bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&k,1,0);
                if (bVar2) {
                  g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
                  bVar2 = true;
                }
                else {
                  bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&k,2,4);
                  if (bVar2) {
                    g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
                    bVar2 = true;
                  }
                  else {
                    bVar2 = false;
                  }
                }
              }
            }
            else {
              g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
              bVar2 = true;
            }
          }
          else {
            g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
            bVar2 = true;
          }
        }
        else {
          g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
          bVar2 = true;
        }
      }
      else {
        g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
        bVar2 = true;
      }
    }
    else {
      g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
      bVar2 = true;
    }
    DenseGraph::~DenseGraph((DenseGraph *)&k);
    DenseGraph::~DenseGraph((DenseGraph *)&g_4.s._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (bVar2) goto LAB_00103265;
  }
  else if (testCase == 6) {
    gt.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0x14;
    gt.s._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 100;
    DenseGraph::DenseGraph((DenseGraph *)&a,0x14);
    for (b = 0; (uint)b < (uint)gt.s._M_t._M_impl.super__Rb_tree_header._M_node_count; b = b + 1) {
      g_5.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (b + 0x20423U ^ b * b * 0xc27 + 0x3baa5aU) %
           gt.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      DenseGraph::AddEdge((DenseGraph *)&a,
                          (b + 0x7d83U ^ 0x1312a) %
                          gt.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                          g_5.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    }
    DenseGraph::DenseGraph((DenseGraph *)&a_1,(DenseGraph *)&a);
    for (b_1 = 0; (uint)b_1 < (uint)gt.s._M_t._M_impl.super__Rb_tree_header._M_node_count;
        b_1 = b_1 + 1) {
      g2_3.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (b_1 + 0x20423U ^ b_1 * b_1 * 0xc27 + 0x3baa5aU) %
           gt.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      bVar2 = DenseGraph::DoesEdgeExist
                        ((DenseGraph *)&a_1,
                         (b_1 + 0x7d83U ^ 0x1312a) %
                         gt.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                         g2_3.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
      if (!bVar2) {
        g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
        bVar2 = true;
        goto LAB_001022f5;
      }
    }
    DenseGraph::Transpose((DenseGraph *)&a_2,(DenseGraph *)&a);
    for (b_2 = 0; (uint)b_2 < (uint)gt.s._M_t._M_impl.super__Rb_tree_header._M_node_count;
        b_2 = b_2 + 1) {
      bVar2 = DenseGraph::DoesEdgeExist
                        ((DenseGraph *)&a_2,
                         (b_2 + 0x20423U ^ b_2 * b_2 * 0xc27 + 0x3baa5aU) %
                         gt.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                         (b_2 + 0x7d83U ^ 0x1312a) %
                         gt.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
      if (!bVar2) {
        g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
        bVar2 = true;
        goto LAB_001022e9;
      }
    }
    for (n_1 = 0; n_1 < (int)gt.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        n_1 = n_1 + 1) {
      for (k_1 = 0; k_1 < (int)gt.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
          k_1 = k_1 + 1) {
        bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&a_1,n_1,k_1);
        if (bVar2) {
          bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&a_2,k_1,n_1);
          if (!bVar2) {
            g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
            bVar2 = true;
            goto LAB_001022e9;
          }
        }
        else {
          bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&a_2,k_1,n_1);
          if (bVar2) {
            g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
            bVar2 = true;
            goto LAB_001022e9;
          }
        }
      }
    }
    bVar2 = false;
LAB_001022e9:
    DenseGraph::~DenseGraph((DenseGraph *)&a_2);
LAB_001022f5:
    DenseGraph::~DenseGraph((DenseGraph *)&a_1);
    DenseGraph::~DenseGraph((DenseGraph *)&a);
    if (bVar2) goto LAB_00103265;
  }
  else if (testCase == 7) {
    gt_1.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1000;
    DenseGraph::DenseGraph((DenseGraph *)&a_3,0x79);
    for (b_3 = 0; (uint)b_3 < gt_1.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        b_3 = b_3 + 1) {
      g_6.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (b_3 + 0x20423U ^ b_3 * b_3 * 0xc27 + 0x3baa5aU) % 0x79;
      DenseGraph::AddEdge((DenseGraph *)&a_3,(b_3 + 0x7d83U ^ 0x1312a) % 0x79,
                          g_6.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    }
    DenseGraph::DenseGraph((DenseGraph *)&a_4,(DenseGraph *)&a_3);
    for (b_4 = 0; (uint)b_4 < gt_1.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        b_4 = b_4 + 1) {
      g2_4.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (b_4 + 0x20423U ^ b_4 * b_4 * 0xc27 + 0x3baa5aU) % 0x79;
      bVar2 = DenseGraph::DoesEdgeExist
                        ((DenseGraph *)&a_4,(b_4 + 0x7d83U ^ 0x1312a) % 0x79,
                         g2_4.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
      if (!bVar2) {
        g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
        bVar2 = true;
        goto LAB_00102725;
      }
    }
    DenseGraph::Transpose((DenseGraph *)&a_5,(DenseGraph *)&a_3);
    for (b_5 = 0; (uint)b_5 < gt_1.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        b_5 = b_5 + 1) {
      bVar2 = DenseGraph::DoesEdgeExist
                        ((DenseGraph *)&a_5,(b_5 + 0x20423U ^ b_5 * b_5 * 0xc27 + 0x3baa5aU) % 0x79,
                         (b_5 + 0x7d83U ^ 0x1312a) % 0x79);
      if (!bVar2) {
        g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
        bVar2 = true;
        goto LAB_00102719;
      }
    }
    for (n_2 = 0; n_2 < 0x79; n_2 = n_2 + 1) {
      for (k_2 = 0; k_2 < 0x79; k_2 = k_2 + 1) {
        bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&a_4,n_2,k_2);
        if (bVar2) {
          bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&a_5,k_2,n_2);
          if (!bVar2) {
            g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
            bVar2 = true;
            goto LAB_00102719;
          }
        }
        else {
          bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&a_5,k_2,n_2);
          if (bVar2) {
            g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
            bVar2 = true;
            goto LAB_00102719;
          }
        }
      }
    }
    bVar2 = false;
LAB_00102719:
    DenseGraph::~DenseGraph((DenseGraph *)&a_5);
LAB_00102725:
    DenseGraph::~DenseGraph((DenseGraph *)&a_4);
    DenseGraph::~DenseGraph((DenseGraph *)&a_3);
    if (bVar2) goto LAB_00103265;
  }
  else if (testCase == 8) {
    gt_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 100000;
    DenseGraph::DenseGraph((DenseGraph *)&a_6,1000);
    for (b_6 = 0; (uint)b_6 < gt_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        b_6 = b_6 + 1) {
      g_7.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (b_6 + 0x20423U ^ b_6 * b_6 * 0xc27 + 0x3baa5aU) % 1000;
      DenseGraph::AddEdge((DenseGraph *)&a_6,(b_6 + 0x7d83U ^ 0x1312a) % 1000,
                          g_7.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    }
    DenseGraph::DenseGraph((DenseGraph *)&a_7,(DenseGraph *)&a_6);
    for (b_7 = 0; (uint)b_7 < gt_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        b_7 = b_7 + 1) {
      g2_5.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (b_7 + 0x20423U ^ b_7 * b_7 * 0xc27 + 0x3baa5aU) % 1000;
      bVar2 = DenseGraph::DoesEdgeExist
                        ((DenseGraph *)&a_7,(b_7 + 0x7d83U ^ 0x1312a) % 1000,
                         g2_5.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
      if (!bVar2) {
        g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
        bVar2 = true;
        goto LAB_00102b55;
      }
    }
    DenseGraph::Transpose((DenseGraph *)&a_8,(DenseGraph *)&a_6);
    for (b_8 = 0; (uint)b_8 < gt_2.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        b_8 = b_8 + 1) {
      bVar2 = DenseGraph::DoesEdgeExist
                        ((DenseGraph *)&a_8,(b_8 + 0x20423U ^ b_8 * b_8 * 0xc27 + 0x3baa5aU) % 1000,
                         (b_8 + 0x7d83U ^ 0x1312a) % 1000);
      if (!bVar2) {
        g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
        bVar2 = true;
        goto LAB_00102b49;
      }
    }
    for (n_3 = 0; n_3 < 1000; n_3 = n_3 + 1) {
      for (k_3 = 0; k_3 < 1000; k_3 = k_3 + 1) {
        bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&a_7,n_3,k_3);
        if (bVar2) {
          bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&a_8,k_3,n_3);
          if (!bVar2) {
            g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
            bVar2 = true;
            goto LAB_00102b49;
          }
        }
        else {
          bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&a_8,k_3,n_3);
          if (bVar2) {
            g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
            bVar2 = true;
            goto LAB_00102b49;
          }
        }
      }
    }
    bVar2 = false;
LAB_00102b49:
    DenseGraph::~DenseGraph((DenseGraph *)&a_8);
LAB_00102b55:
    DenseGraph::~DenseGraph((DenseGraph *)&a_7);
    DenseGraph::~DenseGraph((DenseGraph *)&a_6);
    if (bVar2) goto LAB_00103265;
  }
  else if (testCase == 9) {
    gt_3.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 100;
    DenseGraph::DenseGraph((DenseGraph *)&a_9,1000);
    for (b_9 = 0; (uint)b_9 < gt_3.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        b_9 = b_9 + 1) {
      a_14 = (b_9 + 0x7d83U ^ 0x1312a) % 1000;
      g_8.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (b_9 + 0x20423U ^ b_9 * b_9 * 0xc27 + 0x3baa5aU) % 1000;
      DenseGraph::AddEdge((DenseGraph *)&a_9,a_14,
                          g_8.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
      DenseGraph::RemoveEdge
                ((DenseGraph *)&a_9,a_14,
                 g_8.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    }
    DenseGraph::DenseGraph((DenseGraph *)&a_10,(DenseGraph *)&a_9);
    for (b_10 = 0; (uint)b_10 < gt_3.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        b_10 = b_10 + 1) {
      bVar2 = DenseGraph::DoesEdgeExist
                        ((DenseGraph *)&a_10,(b_10 + 0x7d83U ^ 0x1312a) % 1000,
                         (b_10 + 0x20423U ^ b_10 * b_10 * 0xc27 + 0x3baa5aU) % 1000);
      if (bVar2) {
        g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
        bVar2 = true;
        goto LAB_00102d99;
      }
    }
    bVar2 = false;
LAB_00102d99:
    DenseGraph::~DenseGraph((DenseGraph *)&a_10);
    DenseGraph::~DenseGraph((DenseGraph *)&a_9);
    if (bVar2) goto LAB_00103265;
  }
  else if (testCase == 10) {
    gt_4.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 200000;
    DenseGraph::DenseGraph((DenseGraph *)&a_11,999);
    for (b_11 = 0; (uint)b_11 < gt_4.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        b_11 = b_11 + 1) {
      g_9.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (b_11 + 0x20423U ^ b_11 * b_11 * 0xc27 + 0x3baa5aU) % 999;
      DenseGraph::AddEdge((DenseGraph *)&a_11,(b_11 + 0x7d83U ^ 0x1312a) % 999,
                          g_9.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    }
    DenseGraph::Transpose((DenseGraph *)local_5b8,(DenseGraph *)&a_11);
    DenseGraph::Transpose((DenseGraph *)&a_12,(DenseGraph *)local_5b8);
    DenseGraph::operator=((DenseGraph *)&a_11,(DenseGraph *)&a_12);
    DenseGraph::~DenseGraph((DenseGraph *)&a_12);
    for (b_12 = 0; (uint)b_12 < gt_4.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        b_12 = b_12 + 1) {
      g2_6.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (b_12 + 0x20423U ^ b_12 * b_12 * 0xc27 + 0x3baa5aU) % 999;
      bVar2 = DenseGraph::DoesEdgeExist
                        ((DenseGraph *)&a_11,(b_12 + 0x7d83U ^ 0x1312a) % 999,
                         g2_6.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
      if (!bVar2) {
        g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
        bVar2 = true;
        goto LAB_00103210;
      }
    }
    DenseGraph::Transpose((DenseGraph *)&a_13,(DenseGraph *)&a_11);
    for (b_13 = 0; (uint)b_13 < gt_4.s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        b_13 = b_13 + 1) {
      bVar2 = DenseGraph::DoesEdgeExist
                        ((DenseGraph *)&a_13,
                         (b_13 + 0x20423U ^ b_13 * b_13 * 0xc27 + 0x3baa5aU) % 999,
                         (b_13 + 0x7d83U ^ 0x1312a) % 999);
      if (!bVar2) {
        g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
        bVar2 = true;
        goto LAB_00103204;
      }
    }
    for (local_648 = 0; local_648 < 999; local_648 = local_648 + 1) {
      for (local_64c = 0; local_64c < 999; local_64c = local_64c + 1) {
        bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&a_11,local_648,local_64c);
        if (bVar2) {
          bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&a_13,local_64c,local_648);
          if (!bVar2) {
            g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
            bVar2 = true;
            goto LAB_00103204;
          }
        }
        else {
          bVar2 = DenseGraph::DoesEdgeExist((DenseGraph *)&a_13,local_64c,local_648);
          if (bVar2) {
            g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
            bVar2 = true;
            goto LAB_00103204;
          }
        }
      }
    }
    bVar2 = false;
LAB_00103204:
    DenseGraph::~DenseGraph((DenseGraph *)&a_13);
LAB_00103210:
    DenseGraph::~DenseGraph((DenseGraph *)local_5b8);
    DenseGraph::~DenseGraph((DenseGraph *)&a_11);
    if (bVar2) goto LAB_00103265;
  }
  g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
LAB_00103265:
  return (bool)(g.s._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1);
}

Assistant:

bool runCase(int testCase) {
    if (testCase == 1) {
        DenseGraph g;
        g.AddEdge(0,1);
        if (!g.DoesEdgeExist(0,1)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
    } else
    if (testCase == 2) {
        DenseGraph g(4);
        g.AddEdge(0,1);
        g.AddEdge(0,2);
        g.AddEdge(1,2);
        g.AddEdge(1,3);
        if (!g.DoesEdgeExist(0,1)) return false;
        if (!g.DoesEdgeExist(0,2)) return false;
        if (!g.DoesEdgeExist(1,2)) return false;
        if (!g.DoesEdgeExist(1,3)) return false;
        if (g.DoesEdgeExist(0,3)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
    } else
    if (testCase == 3) {
        DenseGraph g2(4);
        DenseGraph g(g2);
        g.AddEdge(0,1);
        g.AddEdge(0,2);
        g.AddEdge(1,2);
        g.AddEdge(1,3);
        if (!g.DoesEdgeExist(0,1)) return false;
        if (!g.DoesEdgeExist(0,2)) return false;
        if (!g.DoesEdgeExist(1,2)) return false;
        if (!g.DoesEdgeExist(1,3)) return false;
        if (g.DoesEdgeExist(0,3)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
    } else
    if (testCase == 4) {
        DenseGraph g2(4);
        DenseGraph g = g2;
        g.AddEdge(0,1);
        g.AddEdge(0,2);
        g.AddEdge(1,2);
        g.AddEdge(1,3);
        g.AddEdge(2,3);
        g.AddEdge(1,0);
        g.RemoveEdge(1,0);
        g.AddEdge(0,3);
        g.RemoveEdge(0,3);
        g.AddEdge(3,2);
        g.RemoveEdge(3,2);
        g.AddEdge(3,3);

        if (!g.DoesEdgeExist(0,1)) return false;
        if (!g.DoesEdgeExist(0,2)) return false;
        if (!g.DoesEdgeExist(1,2)) return false;
        if (!g.DoesEdgeExist(1,3)) return false;
        if (!g.DoesEdgeExist(2,3)) return false;
        if (!g.DoesEdgeExist(3,3)) return false;
        if (g.DoesEdgeExist(0,3)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
        if (g.DoesEdgeExist(3,2)) return false;


    } else
    if (testCase == 5) {
        DenseGraph g2(5);
        DenseGraph g(2);
        g = g2;
        g.RemoveEdge(1,2);
        g.RemoveEdge(0,1);
        g.AddEdge(0,1);
        g.AddEdge(0,2);
        g.AddEdge(1,2);
        g.RemoveEdge(1,3);
        g.AddEdge(1,3);
        g.RemoveEdge(4,2);
        g.AddEdge(4,2);
        g.RemoveEdge(1,0);
        g.AddEdge(0,3);
        g.RemoveEdge(0,3);
        g.AddEdge(3,2);
        g.RemoveEdge(3,2);

        if (!g.DoesEdgeExist(0,1)) return false;
        if (!g.DoesEdgeExist(0,2)) return false;
        if (!g.DoesEdgeExist(1,2)) return false;
        if (!g.DoesEdgeExist(1,3)) return false;
        if (!g.DoesEdgeExist(4,2)) return false;
        if (g.DoesEdgeExist(0,3)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
        if (g.DoesEdgeExist(2,4)) return false;
    } else
    if (testCase == 6) {
        int n = 20;
        int k = 100;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
        }
        DenseGraph g = gt;
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g.DoesEdgeExist(a,b)) return false;
        }
        DenseGraph g2 = gt.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g2.DoesEdgeExist(b,a)) return false;
        }
        for (int i = 0; i < n; i++) {
            for (int j = 0; j < n; j++) {
                if (g.DoesEdgeExist(i,j)) {
                    if (!g2.DoesEdgeExist(j,i)) return false;
                } else {
                    if (g2.DoesEdgeExist(j,i)) return false;
                }
            }
        }


    } else
    if (testCase == 7) {
        int n = 121;
        int k = 1000;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
        }
        DenseGraph g = gt;
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g.DoesEdgeExist(a,b)) return false;
        }
        DenseGraph g2 = gt.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g2.DoesEdgeExist(b,a)) return false;
        }
        for (int i = 0; i < n; i++) {
            for (int j = 0; j < n; j++) {
                if (g.DoesEdgeExist(i,j)) {
                    if (!g2.DoesEdgeExist(j,i)) return false;
                } else {
                    if (g2.DoesEdgeExist(j,i)) return false;
                }
            }
        }
    } else
    if (testCase == 8) {
        int n = 1000;
        int k = 100000;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
        }
        DenseGraph g = gt;
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g.DoesEdgeExist(a,b)) return false;
        }
        DenseGraph g2 = gt.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g2.DoesEdgeExist(b,a)) return false;
        }
        for (int i = 0; i < n; i++) {
            for (int j = 0; j < n; j++) {
                if (g.DoesEdgeExist(i,j)) {
                    if (!g2.DoesEdgeExist(j,i)) return false;
                } else {
                    if (g2.DoesEdgeExist(j,i)) return false;
                }
            }
        }
    } else
    if (testCase == 9) {
        int n = 1000;
        int k = 100;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
            gt.RemoveEdge(a,b);
        }
        DenseGraph g = gt;
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (g.DoesEdgeExist(a,b)) return false;
        }
    } else
    if (testCase == 10) {
        int n = 999;
        int k = 200000;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
        }
        DenseGraph g = gt.Transpose();
        gt = g.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!gt.DoesEdgeExist(a,b)) return false;
        }
        DenseGraph g2 = gt.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g2.DoesEdgeExist(b,a)) return false;
        }
        for (int i = 0; i < n; i++) {
            for (int j = 0; j < n; j++) {
                if (gt.DoesEdgeExist(i,j)) {
                    if (!g2.DoesEdgeExist(j,i)) return false;
                } else {
                    if (g2.DoesEdgeExist(j,i)) return false;
                }
            }
        }
    }
    return true;
}